

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

double ZopfliCalculateBlockSize(ZopfliLZ77Store *lz77,size_t lstart,size_t lend,int btype)

{
  long lVar1;
  size_t sVar2;
  int in_ECX;
  size_t in_RDX;
  size_t in_RSI;
  ZopfliLZ77Store *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t blocks;
  size_t rem;
  size_t length;
  double result;
  uint d_lengths [32];
  uint ll_lengths [288];
  double local_530;
  uint local_528 [32];
  uint local_4a8 [296];
  double local_8;
  
  if (in_ECX == 0) {
    sVar2 = ZopfliLZ77GetByteRange(in_RDI,in_RSI,in_RDX);
    lVar1 = sVar2 * 8 + ((sVar2 / 0xffff + 1) - (ulong)(sVar2 % 0xffff == 0)) * 0x28;
    auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar3._0_8_ = lVar1;
    auVar3._12_4_ = 0x45300000;
    local_8 = (auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
  }
  else {
    if (in_ECX == 1) {
      GetFixedTree(local_4a8,local_528);
      sVar2 = CalculateBlockSymbolSize
                        ((uint *)ll_lengths._1032_8_,(uint *)ll_lengths._1024_8_,
                         (ZopfliLZ77Store *)ll_lengths._1016_8_,ll_lengths._1008_8_,
                         ll_lengths._1000_8_);
      auVar4._8_4_ = (int)(sVar2 >> 0x20);
      auVar4._0_8_ = sVar2;
      auVar4._12_4_ = 0x45300000;
      local_530 = (auVar4._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
    }
    else {
      local_530 = GetDynamicLengths((ZopfliLZ77Store *)ll_lengths._1024_8_,ll_lengths._1016_8_,
                                    ll_lengths._1008_8_,(uint *)ll_lengths._1000_8_,
                                    (uint *)ll_lengths._992_8_);
    }
    local_530 = local_530 + 3.0;
    local_8 = local_530;
  }
  return local_8;
}

Assistant:

double ZopfliCalculateBlockSize(const ZopfliLZ77Store* lz77,
                                size_t lstart, size_t lend, int btype) {
  unsigned ll_lengths[ZOPFLI_NUM_LL];
  unsigned d_lengths[ZOPFLI_NUM_D];

  double result = 3; /* bfinal and btype bits */

  if (btype == 0) {
    size_t length = ZopfliLZ77GetByteRange(lz77, lstart, lend);
    size_t rem = length % 65535;
    size_t blocks = length / 65535 + (rem ? 1 : 0);
    /* An uncompressed block must actually be split into multiple blocks if it's
       larger than 65535 bytes long. Eeach block header is 5 bytes: 3 bits,
       padding, LEN and NLEN (potential less padding for first one ignored). */
    return blocks * 5 * 8 + length * 8;
  } if (btype == 1) {
    GetFixedTree(ll_lengths, d_lengths);
    result += CalculateBlockSymbolSize(
        ll_lengths, d_lengths, lz77, lstart, lend);
  } else {
    result += GetDynamicLengths(lz77, lstart, lend, ll_lengths, d_lengths);
  }

  return result;
}